

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd7 *p;
  CPpmd7z_RangeDec *rc;
  size_t *psVar1;
  void *pvVar2;
  rar *rar;
  size_t sVar3;
  void *pvVar4;
  rar_filter *filter;
  void *pvVar5;
  long lVar6;
  byte *pbVar7;
  uint8_t *puVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  void *pvVar15;
  uchar *puVar16;
  uLong uVar17;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  void *__src;
  long end;
  ulong uVar21;
  byte bVar22;
  ulong uStack_b0;
  int local_a8;
  size_t local_38;
  
  pvVar2 = a->format->data;
  if (*(int *)((long)pvVar2 + 0x4f50) == -1) {
    *(undefined4 *)((long)pvVar2 + 0x4f50) = 0;
  }
  if (0 < *(long *)((long)pvVar2 + 0xa0)) {
    __archive_read_consume(a,*(long *)((long)pvVar2 + 0xa0));
    *(undefined8 *)((long)pvVar2 + 0xa0) = 0;
  }
  *buff = (void *)0x0;
  if ((*(char *)((long)pvVar2 + 0xed) != '\0') ||
     (*(long *)((long)pvVar2 + 0x28) <= *(long *)((long)pvVar2 + 200))) {
    *size = 0;
    lVar13 = *(long *)((long)pvVar2 + 0xb8);
    *offset = lVar13;
    lVar18 = *(long *)((long)pvVar2 + 0x28);
    if (*(long *)((long)pvVar2 + 0x28) < lVar13) {
      lVar18 = lVar13;
    }
    *offset = lVar18;
    return 1;
  }
  if (4 < *(byte *)((long)pvVar2 + 0x17) - 0x31) {
    if (*(byte *)((long)pvVar2 + 0x17) == 0x30) {
      pbVar7 = (byte *)a->format->data;
      if ((*(long *)(pbVar7 + 0xa8) == 0) && (((*pbVar7 & 1) == 0 || ((pbVar7[0x18] & 2) == 0)))) {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)(pbVar7 + 0xb8);
        if (*(long *)(pbVar7 + 8) == *(long *)(pbVar7 + 0xf0)) {
          pbVar7[0xed] = 1;
          return 1;
        }
        pcVar19 = "File CRC error";
      }
      else {
        puVar16 = (uchar *)rar_read_ahead(a,1,(ssize_t *)&local_38);
        *buff = puVar16;
        if (0 < (long)local_38) {
          *size = local_38;
          lVar13 = *(long *)(pbVar7 + 0xb8);
          *offset = lVar13;
          *(size_t *)(pbVar7 + 0xb8) = lVar13 + local_38;
          *(size_t *)(pbVar7 + 200) = *(long *)(pbVar7 + 200) + local_38;
          *(size_t *)(pbVar7 + 0xa8) = *(long *)(pbVar7 + 0xa8) - local_38;
          *(size_t *)(pbVar7 + 0xa0) = local_38;
          uVar17 = cm_zlib_z_crc32(*(unsigned_long *)(pbVar7 + 0xf0),puVar16,(uInt)local_38);
          *(uLong *)(pbVar7 + 0xf0) = uVar17;
          return 0;
        }
        pcVar19 = "Truncated RAR file data";
      }
    }
    else {
      pcVar19 = "Unsupported compression method for RAR file.";
    }
    archive_set_error(&a->archive,0x54,pcVar19);
    return -0x1e;
  }
  lVar13 = 0;
LAB_00480cdd:
  if (lVar13 == 0x401) {
LAB_00481607:
    local_a8 = -0x1e;
LAB_0048160d:
    Ppmd7_Free((CPpmd7 *)((long)pvVar2 + 0x3d8));
    *(undefined1 *)((long)pvVar2 + 0x388) = 1;
    *(undefined1 *)((long)pvVar2 + 0x3d0) = 0;
    return local_a8;
  }
  lVar13 = lVar13 + 1;
  rar = (rar *)a->format->data;
  p = &rar->ppmd7_context;
  rc = &rar->range_dec;
  local_a8 = 0;
LAB_00480d47:
  if (rar->valid == '\0') goto LAB_00481607;
  sVar3 = (rar->filters).bytes_ready;
  if (sVar3 == 0) {
    if (rar->ppmd_eod != '\0') {
LAB_0048138f:
      uVar12 = rar->unp_offset;
      if ((ulong)uVar12 != 0) {
        puVar16 = rar->unp_buffer;
        *buff = puVar16;
        *size = (ulong)uVar12;
        lVar13 = rar->offset_outgoing;
        *offset = lVar13;
        rar->offset_outgoing = lVar13 + *size;
        uVar17 = cm_zlib_z_crc32(rar->crc_calculated,puVar16,(uInt)*size);
        rar->crc_calculated = uVar17;
        rar->unp_offset = 0;
        return 0;
      }
      *buff = (void *)0x0;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc == rar->crc_calculated) {
        rar->entry_eof = '\x01';
        local_a8 = 1;
        goto LAB_0048160d;
      }
      pcVar19 = "File CRC error";
LAB_00481600:
      archive_set_error(&a->archive,0x54,pcVar19);
      goto LAB_00481607;
    }
    if (rar->dictionary_size != 0) {
      if (rar->unp_size <= rar->offset) goto LAB_0048138f;
      if ((rar->is_ppmd_block != '\0') || (uVar14 = rar->bytes_uncopied, (long)uVar14 < 1))
      goto LAB_00480d9c;
      uVar21 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
      if (uVar14 < uVar21) {
        uVar21 = uVar14;
      }
      uVar12 = copy_from_lzss_window_to_unp(a,buff,rar->offset,(int)uVar21);
      uVar14 = (ulong)uVar12;
      if (uVar12 != 0) goto LAB_00481486;
      rar->offset = rar->offset + uVar21;
      rar->bytes_uncopied = rar->bytes_uncopied - uVar21;
      puVar16 = (uchar *)*buff;
      local_a8 = 0;
      if (puVar16 != (uchar *)0x0) {
        rar->unp_offset = 0;
        *size = (ulong)rar->unp_buffer_size;
        lVar13 = rar->offset_outgoing;
        *offset = lVar13;
        rar->offset_outgoing = lVar13 + *size;
        uVar17 = cm_zlib_z_crc32(rar->crc_calculated,puVar16,(uInt)*size);
        rar->crc_calculated = uVar17;
        return 0;
      }
      goto LAB_00480d47;
    }
LAB_00480d9c:
    if ((rar->filters).lastend == (rar->filters).filterstart) {
      pvVar4 = a->format->data;
      filter = *(rar_filter **)((long)pvVar4 + 0x3a0);
      lVar18 = *(long *)((long)pvVar4 + 0x3a8);
      uVar12 = filter->blocklength;
      *(undefined8 *)((long)pvVar4 + 0x3a8) = 0x7fffffffffffffff;
      uVar14 = expand(a,(ulong)uVar12 + lVar18);
      uVar12 = filter->blocklength;
      if (uVar14 != (ulong)uVar12 + lVar18) goto LAB_00481607;
      pvVar15 = *(void **)((long)pvVar4 + 0x390);
      if (pvVar15 == (void *)0x0) {
        pvVar15 = calloc(1,0x40024);
        *(void **)((long)pvVar4 + 0x390) = pvVar15;
        if (pvVar15 == (void *)0x0) goto LAB_00481607;
      }
      pvVar5 = a->format->data;
      uVar20 = (uint)lVar18 & *(uint *)((long)pvVar5 + 0x358);
      uVar9 = (*(uint *)((long)pvVar5 + 0x358) - uVar20) + 1;
      if ((int)uVar9 < 0) {
        archive_set_error(&a->archive,0x54,"Bad RAR file data");
        local_a8 = -0x1e;
        goto LAB_0048160d;
      }
      __src = (void *)((long)(int)uVar20 + *(long *)((long)pvVar5 + 0x350));
      if (uVar12 - uVar9 != 0 && (int)uVar9 <= (int)uVar12) {
        memcpy((void *)((long)pvVar15 + 0x20),__src,(ulong)uVar9);
        __src = *(void **)((long)pvVar5 + 0x350);
        uVar12 = uVar12 - uVar9;
      }
      memcpy((void *)((long)pvVar15 + 0x20),__src,(long)(int)uVar12);
      iVar11 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar4 + 0x390),
                              *(size_t *)((long)pvVar4 + 0xb8));
      while( true ) {
        if (iVar11 == 0) goto LAB_00481607;
        uVar12 = filter->filteredblockaddress;
        uVar9 = filter->filteredblocklength;
        *(rar_filter **)((long)pvVar4 + 0x3a0) = filter->next;
        filter->next = (rar_filter *)0x0;
        delete_filter(filter);
        filter = *(rar_filter **)((long)pvVar4 + 0x3a0);
        if (filter == (rar_filter *)0x0) goto LAB_00481059;
        uVar21 = filter->blockstartpos;
        if ((uVar21 != *(ulong *)((long)pvVar4 + 0x3a8)) || (filter->blocklength != uVar9)) break;
        memmove((void *)(*(long *)((long)pvVar4 + 0x390) + 0x20),
                (void *)(*(long *)((long)pvVar4 + 0x390) + (ulong)uVar12 + 0x20),(ulong)uVar9);
        iVar11 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar4 + 0x390),
                                *(size_t *)((long)pvVar4 + 0xb8));
      }
      if (uVar21 < uVar14) goto LAB_00481607;
      *(ulong *)((long)pvVar4 + 0x3a8) = uVar21;
LAB_00481059:
      *(ulong *)((long)pvVar4 + 0x3b8) = uVar14;
      *(ulong *)((long)pvVar4 + 0x3c0) = *(long *)((long)pvVar4 + 0x390) + (ulong)uVar12 + 0x20;
      *(ulong *)((long)pvVar4 + 0x3c8) = (ulong)uVar9;
LAB_004811da:
      puVar16 = (uchar *)*buff;
      if (puVar16 != (uchar *)0x0) {
        rar->unp_offset = 0;
        *size = (ulong)rar->unp_buffer_size;
        goto LAB_0048146c;
      }
      goto LAB_00480d47;
    }
    if (((rar->br).next_in == (uchar *)0x0) &&
       (local_a8 = 0, 0 < *(long *)((long)a->format->data + 0xa8))) {
      puVar16 = (uchar *)rar_read_ahead(a,1,&(rar->br).avail_in);
      (rar->br).next_in = puVar16;
      if (puVar16 == (uchar *)0x0) {
        pcVar19 = "Truncated RAR file data";
        goto LAB_00481600;
      }
      if ((rar->br).cache_avail == 0) {
        rar_br_fillup(a,&rar->br);
      }
    }
    if ((rar->start_new_table != '\0') && (local_a8 = parse_codes(a), local_a8 < -0x14))
    goto LAB_0048155e;
    if (rar->is_ppmd_block == '\0') {
      lVar18 = rar->offset;
      end = (ulong)rar->dictionary_size + lVar18;
      lVar6 = (rar->filters).filterstart;
      if (lVar6 < end) {
        end = lVar6;
      }
      uVar14 = expand(a,end);
      if ((long)uVar14 < 0) goto LAB_00481486;
      uStack_b0 = uVar14 - lVar18;
      rar->bytes_uncopied = uStack_b0;
      (rar->filters).lastend = uVar14;
      if ((uStack_b0 == 0) && (uVar14 != (rar->filters).filterstart)) {
        pcVar19 = "Internal error extracting RAR file";
        goto LAB_00481600;
      }
    }
    else {
      iVar11 = Ppmd7_DecodeSymbol(p,&rc->p);
      if (iVar11 < 0) {
LAB_0048157a:
        pcVar19 = "Invalid symbol";
        goto LAB_00481600;
      }
      if (iVar11 == rar->ppmd_escape) {
        iVar10 = Ppmd7_DecodeSymbol(p,&rc->p);
        if (iVar10 < 0) goto LAB_0048157a;
        switch(iVar10) {
        case 0:
          goto switchD_00480f10_caseD_0;
        default:
          lzss_emit_literal(rar,(uint8_t)iVar11);
          uStack_b0 = 1;
          break;
        case 2:
          rar->ppmd_eod = '\x01';
          goto LAB_004811da;
        case 3:
          archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
          local_a8 = -0x19;
          goto LAB_0048160d;
        case 4:
          uVar12 = 0;
          bVar22 = 0x10;
          for (iVar11 = 2; iVar10 = Ppmd7_DecodeSymbol(p,&rc->p), -1 < iVar11; iVar11 = iVar11 + -1)
          {
            if (iVar10 < 0) goto LAB_004814d0;
            uVar12 = uVar12 | iVar10 << (bVar22 & 0x1f);
            bVar22 = bVar22 - 8;
          }
          if (iVar10 < 0) {
LAB_004814d0:
            pcVar19 = "Invalid symbol";
            goto LAB_00481600;
          }
          uStack_b0 = (ulong)(iVar10 + 0x20U);
          lzss_emit_match(rar,uVar12 + 2,iVar10 + 0x20U);
          break;
        case 5:
          iVar11 = Ppmd7_DecodeSymbol(p,&rc->p);
          if (iVar11 < 0) goto LAB_004814d0;
          uStack_b0 = (ulong)(iVar11 + 4U);
          lzss_emit_match(rar,1,iVar11 + 4U);
        }
      }
      else {
        lzss_emit_literal(rar,(uint8_t)iVar11);
        uStack_b0 = 1;
      }
      uStack_b0 = uStack_b0 + rar->bytes_uncopied;
      rar->bytes_uncopied = uStack_b0;
    }
    uVar21 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
    if ((long)uStack_b0 < (long)uVar21) {
      uVar21 = uStack_b0;
    }
    uVar12 = copy_from_lzss_window_to_unp(a,buff,rar->offset,(int)uVar21);
    uVar14 = (ulong)uVar12;
    if (uVar12 == 0) {
      rar->offset = rar->offset + uVar21;
      rar->bytes_uncopied = rar->bytes_uncopied - uVar21;
      local_a8 = 0;
      goto LAB_004811da;
    }
LAB_00481486:
    local_a8 = (int)uVar14;
  }
  else {
    uVar12 = rar->unp_offset;
    if ((ulong)uVar12 == 0) {
      puVar8 = (rar->filters).bytes;
      *buff = puVar8;
      *size = sVar3;
      rar->offset = rar->offset + sVar3;
      lVar13 = rar->offset_outgoing;
      *offset = lVar13;
      rar->offset_outgoing = lVar13 + *size;
      psVar1 = &(rar->filters).bytes_ready;
      *psVar1 = *psVar1 - *size;
      (rar->filters).bytes = puVar8 + *size;
      puVar16 = (uchar *)*buff;
    }
    else {
      puVar16 = rar->unp_buffer;
      *buff = puVar16;
      *size = (ulong)uVar12;
      rar->unp_offset = 0;
LAB_0048146c:
      lVar13 = rar->offset_outgoing;
      *offset = lVar13;
      rar->offset_outgoing = lVar13 + *size;
    }
    uVar17 = cm_zlib_z_crc32(rar->crc_calculated,puVar16,(uInt)*size);
    rar->crc_calculated = uVar17;
  }
LAB_0048155e:
  if (local_a8 == -0x14) {
    return -0x14;
  }
  if (local_a8 == 0) {
    return 0;
  }
  goto LAB_0048160d;
switchD_00480f10_caseD_0:
  rar->start_new_table = '\x01';
  goto LAB_00480cdd;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  *buff = NULL;
  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset, 0);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN) {
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
      rar->start_new_table = 1;
      rar->ppmd_valid = 0;
    }
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}